

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void __thiscall NULLCIO::WriteToConsole(NULLCIO *this,NULLCArray data)

{
  uint local_28;
  uint i;
  NULLCArray data_local;
  
  if ((writeFunc != (code *)0x0) && (this != (NULLCIO *)0x0)) {
    for (local_28 = 0; (local_28 < (uint)data.ptr && (this[local_28] != (NULLCIO)0x0));
        local_28 = local_28 + 1) {
      (*writeFunc)(contextFunc,this + local_28,1);
    }
  }
  return;
}

Assistant:

void WriteToConsole(NULLCArray data)
	{
		if(!writeFunc)
			return;

		// Empty arrays are silently ignored
		if(!data.ptr)
			return;
		
		for(unsigned i = 0; i < data.len; i++)
		{
			if(!data.ptr[i])
				return;

			writeFunc(contextFunc, data.ptr + i, 1);
		}
	}